

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

bool __thiscall kratos::Generator::is_auxiliary_var(Generator *this,shared_ptr<kratos::Var> *var)

{
  bool bVar1;
  element_type *peVar2;
  mapped_type *__a;
  bool local_35;
  key_type local_34;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_false> local_30;
  key_type local_24;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_false> local_20;
  __shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_18;
  shared_ptr<kratos::Var> *var_local;
  Generator *this_local;
  
  local_18 = (__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)var;
  var_local = (shared_ptr<kratos::Var> *)this;
  peVar2 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      var);
  local_24 = (*(peVar2->super_IRNode)._vptr_IRNode[7])();
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::shared_ptr<kratos::Var>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>_>_>
       ::find(&this->auxiliary_vars_,&local_24);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::shared_ptr<kratos::Var>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>_>_>
       ::end(&this->auxiliary_vars_);
  bVar1 = std::__detail::operator!=(&local_20,&local_30);
  local_35 = false;
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_18);
    local_34 = (*(peVar2->super_IRNode)._vptr_IRNode[7])();
    __a = std::
          unordered_map<unsigned_int,_std::shared_ptr<kratos::Var>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>_>_>
          ::at(&this->auxiliary_vars_,&local_34);
    local_35 = std::operator==(__a,(shared_ptr<kratos::Var> *)local_18);
  }
  return local_35;
}

Assistant:

bool Generator::is_auxiliary_var(const std::shared_ptr<Var> &var) {
    return auxiliary_vars_.find(var->width()) != auxiliary_vars_.end() &&
           auxiliary_vars_.at(var->width()) == var;
}